

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<Fad<Fad<double>_>_>::Resize(TPZVec<Fad<Fad<double>_>_> *this,int64_t newsize)

{
  undefined8 *puVar1;
  Fad<Fad<double>_> *pFVar2;
  double dVar3;
  undefined1 auVar4 [16];
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  int64_t *piVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  
  if (newsize < 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
  }
  lVar10 = this->fNElements;
  if (lVar10 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar2 = this->fStore;
      if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
        dVar3 = pFVar2[-1].defaultVal.defaultVal;
        if (dVar3 != 0.0) {
          lVar10 = (long)dVar3 * 0x58;
          do {
            Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar2[-1].field_0x0 + lVar10));
            lVar10 = lVar10 + -0x58;
          } while (lVar10 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar3 * 0x58 + 8);
      }
      this->fStore = (Fad<Fad<double>_> *)0x0;
    }
    else {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = newsize;
      uVar6 = SUB168(auVar4 * ZEXT816(0x58),0);
      uVar7 = uVar6 + 8;
      if (0xfffffffffffffff7 < uVar6) {
        uVar7 = 0xffffffffffffffff;
      }
      uVar6 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x58),8) == 0) {
        uVar6 = uVar7;
      }
      piVar8 = (int64_t *)operator_new__(uVar6);
      *piVar8 = newsize;
      lVar9 = 0;
      do {
        *(undefined8 *)((long)piVar8 + lVar9 + 0x10) = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x18) = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x50);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x30) = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)((long)piVar8 + lVar9 + 0x48) = 0;
        puVar1 = (undefined8 *)((long)piVar8 + lVar9 + 0x38);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar9 = lVar9 + 0x58;
      } while (newsize * 0x58 - lVar9 != 0);
      if (newsize <= lVar10) {
        lVar10 = newsize;
      }
      lVar9 = 0;
      if (lVar10 < 1) {
        lVar10 = lVar9;
      }
      while( true ) {
        pFVar2 = this->fStore;
        bVar11 = lVar10 == 0;
        lVar10 = lVar10 + -1;
        if (bVar11) break;
        Fad<Fad<double>_>::operator=
                  ((Fad<Fad<double>_> *)
                   ((long)&((Fad<Fad<double>_> *)(piVar8 + 1))->field_0x0 + lVar9),
                   (Fad<Fad<double>_> *)(&pFVar2->field_0x0 + lVar9));
        lVar9 = lVar9 + 0x58;
      }
      if (pFVar2 != (Fad<Fad<double>_> *)0x0) {
        dVar3 = pFVar2[-1].defaultVal.defaultVal;
        if (dVar3 != 0.0) {
          lVar10 = (long)dVar3 * 0x58;
          do {
            Fad<Fad<double>_>::~Fad((Fad<Fad<double>_> *)(&pFVar2[-1].field_0x0 + lVar10));
            lVar10 = lVar10 + -0x58;
          } while (lVar10 != 0);
        }
        operator_delete__(&pFVar2[-1].defaultVal.defaultVal,(long)dVar3 * 0x58 + 8);
      }
      this->fStore = (Fad<Fad<double>_> *)(piVar8 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}